

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O0

void __thiscall
asio::detail::executor_function::
executor_function<asio::detail::binder0<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>,std::allocator<void>>
          (executor_function *this,
          binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
          *f,allocator<void> *a)

{
  impl<asio::detail::binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>,_std::allocator<void>_>
  *f_00;
  allocator<void> *in_RSI;
  undefined8 *in_RDI;
  ptr p;
  impl<asio::detail::binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>,_std::allocator<void>_>
  *in_stack_ffffffffffffffc0;
  
  f_00 = impl<asio::detail::binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>,_std::allocator<void>_>
         ::ptr::allocate(in_RSI);
  impl<asio::detail::binder0<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>,std::allocator<void>>
  ::
  impl<asio::detail::binder0<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>>
            (in_stack_ffffffffffffffc0,
             (binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
              *)f_00,in_RSI);
  *in_RDI = f_00;
  impl<asio::detail::binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>,_std::allocator<void>_>
  ::ptr::~ptr((ptr *)0x7051dd);
  return;
}

Assistant:

explicit executor_function(F f, const Alloc& a)
  {
    // Allocate and construct an object to wrap the function.
    typedef impl<F, Alloc> impl_type;
    typename impl_type::ptr p = {
      detail::addressof(a), impl_type::ptr::allocate(a), 0 };
    impl_ = new (p.v) impl_type(static_cast<F&&>(f), a);
    p.v = 0;
  }